

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<int,10ul>::
vector_s<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (vector_s<int,10ul> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *last)

{
  int *piVar1;
  size_type sVar2;
  int *piVar3;
  int *piVar4;
  
  *(undefined8 *)this = 0;
  *(vector_s<int,10ul> **)(this + 0x30) = this + 8;
  sVar2 = check_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (this,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          first->_M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     last->_M_current);
  piVar1 = last->_M_current;
  piVar4 = *(int **)(this + 0x30);
  for (piVar3 = first->_M_current; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    *piVar4 = *piVar3;
    piVar4 = piVar4 + 1;
  }
  *(size_type *)this = sVar2;
  return;
}

Assistant:

vector_s(const InputIt& first, const InputIt& last)
    {
        const size_type diff = check_range(first, last);
        size_type i = 0u;
        for (InputIt it = first; it != last; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it);
        }
        size_ = diff;
    }